

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  StkId pTVar1;
  StkId pTVar2;
  int iVar3;
  TValue *io2;
  TValue *io1;
  int i;
  int n_local;
  lua_State *to_local;
  lua_State *from_local;
  
  if (from != to) {
    iVar3 = **(int **)&to[-1].hookmask;
    **(int **)&to[-1].hookmask = iVar3 + 1;
    if (iVar3 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(to) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x7e,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    if ((long)from->top - (long)from->ci->func >> 4 <= (long)n) {
      __assert_fail("((n) < (from->top - from->ci->func)) && \"not enough elements in the stack\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x7f,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    if (from->l_G != to->l_G) {
      __assert_fail("((from->l_G) == (to->l_G)) && \"moving among independent states\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x80,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    if ((long)to->ci->top - (long)to->top >> 4 < (long)n) {
      __assert_fail("(to->ci->top - to->top >= n) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x81,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    from->top = from->top + -(long)n;
    for (io1._0_4_ = 0; (int)io1 < n; io1._0_4_ = (int)io1 + 1) {
      pTVar1 = to->top;
      pTVar2 = from->top;
      pTVar1->value_ = pTVar2[(int)io1].value_;
      pTVar1->tt_ = pTVar2[(int)io1].tt_;
      if ((pTVar1->tt_ & 0x8000) != 0) {
        if ((pTVar1->tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x84,"void lua_xmove(lua_State *, lua_State *, int)");
        }
        if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_00124fa5:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x84,"void lua_xmove(lua_State *, lua_State *, int)");
        }
        if (to != (lua_State *)0x0) {
          if ((pTVar1->tt_ & 0x8000) == 0) {
            __assert_fail("(((io1)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x84,"void lua_xmove(lua_State *, lua_State *, int)");
          }
          if ((((pTVar1->value_).gc)->marked & (to->l_G->currentwhite ^ 0x18)) != 0)
          goto LAB_00124fa5;
        }
      }
      to->top = to->top + 1;
    }
    iVar3 = **(int **)&to[-1].hookmask + -1;
    **(int **)&to[-1].hookmask = iVar3;
    if (iVar3 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(to) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x87,"void lua_xmove(lua_State *, lua_State *, int)");
    }
  }
  return;
}

Assistant:

LUA_API void lua_xmove (lua_State *from, lua_State *to, int n) {
  int i;
  if (from == to) return;
  lua_lock(to);
  api_checknelems(from, n);
  api_check(from, G(from) == G(to), "moving among independent states");
  api_check(from, to->ci->top - to->top >= n, "stack overflow");
  from->top -= n;
  for (i = 0; i < n; i++) {
    setobj2s(to, to->top, from->top + i);
    to->top++;  /* stack already checked by previous 'api_check' */
  }
  lua_unlock(to);
}